

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

bool __thiscall spv::Builder::containsType(Builder *this,Id typeId,Op typeOp,uint width)

{
  Op OVar1;
  Instruction *this_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Id typeId_00;
  int m;
  int op;
  
  do {
    this_00 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[typeId];
    OVar1 = this_00->opCode;
    switch(OVar1) {
    case OpTypeInt:
    case OpTypeFloat:
      if (OVar1 != typeOp) {
        return false;
      }
      uVar4 = Instruction::getImmediateOperand(this_00,0);
      return uVar4 == width;
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
      typeId = getContainedTypeId(this,typeId);
      break;
    default:
      return OVar1 == typeOp;
    case OpTypeStruct:
      op = 0;
      do {
        iVar5 = Instruction::getNumOperands(this_00);
        bVar2 = op < iVar5;
        if (iVar5 <= op) {
          return bVar2;
        }
        typeId_00 = Instruction::getIdOperand(this_00,op);
        bVar3 = containsType(this,typeId_00,typeOp,width);
        op = op + 1;
      } while (!bVar3);
      return bVar2;
    case OpTypePointer:
      return false;
    }
  } while( true );
}

Assistant:

bool Builder::containsType(Id typeId, spv::Op typeOp, unsigned int width) const
{
    const Instruction& instr = *module.getInstruction(typeId);

    Op typeClass = instr.getOpCode();
    switch (typeClass)
    {
    case OpTypeInt:
    case OpTypeFloat:
        return typeClass == typeOp && instr.getImmediateOperand(0) == width;
    case OpTypeStruct:
        for (int m = 0; m < instr.getNumOperands(); ++m) {
            if (containsType(instr.getIdOperand(m), typeOp, width))
                return true;
        }
        return false;
    case OpTypePointer:
        return false;
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
        return containsType(getContainedTypeId(typeId), typeOp, width);
    default:
        return typeClass == typeOp;
    }
}